

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

uint processorstart(logdir *ld)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  int local_4c;
  char *pcStack_48;
  int fd;
  char *prog [4];
  int pid;
  logdir *ld_local;
  
  if ((ld->processor).len == 0) {
    ld_local._4_4_ = 0;
  }
  else if (ld->ppid == 0) {
    while (_Var1 = fork(), _Var1 == -1) {
      pause2("unable to fork for processor",ld->name);
    }
    if (_Var1 == 0) {
      sig_catch(sig_term,sig_defaulthandler);
      sig_catch(sig_alarm,sig_defaulthandler);
      sig_catch(sig_hangup,sig_defaulthandler);
      sig_unblock(sig_term);
      sig_unblock(sig_alarm);
      sig_unblock(sig_hangup);
      if (verbose != 0) {
        strerr_warn("svlogd: info: ","processing: ",ld->name,"/",ld->fnsave,(char *)0x0,
                    (strerr *)0x0);
      }
      iVar2 = open_read(ld->fnsave);
      if (iVar2 == -1) {
        fatal2("unable to open input for processor",ld->name);
      }
      iVar2 = fd_move(0,iVar2);
      if (iVar2 == -1) {
        fatal2("unable to move filedescriptor for processor",ld->name);
      }
      ld->fnsave[0x1a] = 't';
      iVar2 = open_trunc(ld->fnsave);
      if (iVar2 == -1) {
        fatal2("unable to open output for processor",ld->name);
      }
      iVar2 = fd_move(1,iVar2);
      if (iVar2 == -1) {
        fatal2("unable to move filedescriptor for processor",ld->name);
      }
      local_4c = open_read("state");
      if (local_4c == -1) {
        piVar3 = __errno_location();
        if (*piVar3 == error_noent) {
          iVar2 = open_trunc("state");
          if (iVar2 == -1) {
            fatal2("unable to create empty state for processor",ld->name);
          }
          close(iVar2);
          local_4c = open_read("state");
          if (local_4c == -1) {
            fatal2("unable to open state for processor",ld->name);
          }
        }
        else {
          fatal2("unable to open state for processor",ld->name);
        }
      }
      iVar2 = fd_move(4,local_4c);
      if (iVar2 == -1) {
        fatal2("unable to move filedescriptor for processor",ld->name);
      }
      iVar2 = open_trunc("newstate");
      if (iVar2 == -1) {
        fatal2("unable to open newstate for processor",ld->name);
      }
      iVar2 = fd_move(5,iVar2);
      if (iVar2 == -1) {
        fatal2("unable to move filedescriptor for processor",ld->name);
      }
      pcStack_48 = "sh";
      prog[0] = "-c";
      prog[1] = (ld->processor).s;
      prog[2] = (char *)0x0;
      execve("/bin/sh",&stack0xffffffffffffffb8,_environ);
      fatal2("unable to run processor",ld->name);
    }
    ld->ppid = _Var1;
    ld_local._4_4_ = 1;
  }
  else {
    warnx("processor already running",ld->name);
    ld_local._4_4_ = 0;
  }
  return ld_local._4_4_;
}

Assistant:

unsigned int processorstart(struct logdir *ld) {
  int pid;

  if (! ld->processor.len) return(0);
  if (ld->ppid) {
    warnx("processor already running", ld->name);
    return(0);
  }
  while ((pid =fork()) == -1)
    pause2("unable to fork for processor", ld->name);
  if (! pid) {
    char *prog[4];
    int fd;

    /* child */
    sig_uncatch(sig_term);
    sig_uncatch(sig_alarm);
    sig_uncatch(sig_hangup);
    sig_unblock(sig_term);
    sig_unblock(sig_alarm);
    sig_unblock(sig_hangup);

    if (verbose)
      strerr_warn5(INFO, "processing: ", ld->name, "/", ld->fnsave, 0);
    if ((fd =open_read(ld->fnsave)) == -1)
      fatal2("unable to open input for processor", ld->name);
    if (fd_move(0, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);
    ld->fnsave[26] ='t';
    if ((fd =open_trunc(ld->fnsave)) == -1)
      fatal2("unable to open output for processor", ld->name);
    if (fd_move(1, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);
    if ((fd =open_read("state")) == -1) {
      if (errno == error_noent) {
        if ((fd =open_trunc("state")) == -1)
          fatal2("unable to create empty state for processor", ld->name);
        close(fd);
        if ((fd =open_read("state")) == -1)
          fatal2("unable to open state for processor", ld->name);
      }
      else
        fatal2("unable to open state for processor", ld->name);
    }
    if (fd_move(4, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);
    if ((fd =open_trunc("newstate")) == -1)
      fatal2("unable to open newstate for processor", ld->name);
    if (fd_move(5, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);

    prog[0] = "sh";
    prog[1] = "-c";
    prog[2] = ld->processor.s;
    prog[3] = 0;
    execve("/bin/sh", prog, environ);
    fatal2("unable to run processor", ld->name);
  }
  ld->ppid =pid;
  return(1);
}